

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O2

void __thiscall APowerMask::DoEffect(APowerMask *this)

{
  AActor *ent;
  FSoundID local_c;
  
  APowerIronFeet::DoEffect(&this->super_APowerIronFeet);
  if (((byte)level.time & 0x3f) == 0) {
    ent = GC::ReadBarrier<AActor>
                    ((AActor **)&(this->super_APowerIronFeet).super_APowerup.super_AInventory.Owner)
    ;
    local_c.ID = S_FindSound("misc/mask");
    S_Sound(ent,0,&local_c,1.0,3.0);
  }
  return;
}

Assistant:

void APowerMask::DoEffect ()
{
	Super::DoEffect ();
	if (!(level.time & 0x3f))
	{
		S_Sound (Owner, CHAN_AUTO, "misc/mask", 1, ATTN_STATIC);
	}
}